

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

uint8_t * __thiscall
edition_unittest::TestCamelCaseFieldNames::_InternalSerialize
          (TestCamelCaseFieldNames *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  int *piVar1;
  WireFormatLite *pWVar2;
  ForeignMessage *value;
  size_t sVar3;
  anon_union_192_1_493b367e_for_TestCamelCaseFieldNames_3 aVar4;
  int iVar5;
  undefined8 *puVar6;
  uint8_t *puVar7;
  const_pointer piVar8;
  byte *pbVar9;
  ulong uVar10;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar11;
  Value<google::protobuf::internal::GenericTypeHandler<edition_unittest::ForeignMessage>_> *value_00
  ;
  uint uVar12;
  int iVar13;
  char *in_R9;
  RepeatedField<int> *pRVar14;
  string_view s;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  string_view s_03;
  string_view s_04;
  string_view field_name;
  string_view field_name_00;
  string_view field_name_01;
  string_view field_name_02;
  string_view field_name_03;
  string_view field_name_04;
  LogMessageFatal local_40;
  
  aVar4 = this->field_0;
  if (((undefined1  [192])aVar4 & (undefined1  [192])0x10) != (undefined1  [192])0x0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.primitivefield_,target);
  }
  if (((undefined1  [192])aVar4 & (undefined1  [192])0x1) != (undefined1  [192])0x0) {
    puVar6 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.stringfield_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pWVar2 = (WireFormatLite *)*puVar6;
    uVar10 = puVar6[1];
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"edition_unittest.TestCamelCaseFieldNames.StringField";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pWVar2,(char *)(uVar10 & 0xffffffff),1,0x34,field_name);
    s._M_str = (char *)pWVar2;
    s._M_len = uVar10;
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,2,s,target);
  }
  if (((undefined1  [192])aVar4 & (undefined1  [192])0x20) != (undefined1  [192])0x0) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray
                       (3,(this->field_0)._impl_.enumfield_,puVar7);
  }
  if (((undefined1  [192])aVar4 & (undefined1  [192])0x8) != (undefined1  [192])0x0) {
    value = (this->field_0)._impl_.messagefield_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (4,(MessageLite *)value,*(int *)((long)&value->field_0 + 4),target,stream);
  }
  if (((undefined1  [192])aVar4 & (undefined1  [192])0x2) != (undefined1  [192])0x0) {
    puVar6 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.stringpiecefield_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
    ;
    pWVar2 = (WireFormatLite *)*puVar6;
    uVar10 = puVar6[1];
    field_name_00._M_str = in_R9;
    field_name_00._M_len = (size_t)"edition_unittest.TestCamelCaseFieldNames.StringPieceField";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pWVar2,(char *)(uVar10 & 0xffffffff),1,0x39,field_name_00);
    s_00._M_str = (char *)pWVar2;
    s_00._M_len = uVar10;
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,5,s_00,target);
  }
  if (((undefined1  [192])aVar4 & (undefined1  [192])0x4) != (undefined1  [192])0x0) {
    puVar6 = (undefined8 *)
             ((ulong)(this->field_0)._impl_.cordfield_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name_01._M_str = in_R9;
    field_name_01._M_len = (size_t)"edition_unittest.TestCamelCaseFieldNames.CordField";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar6,(char *)(ulong)*(uint *)(puVar6 + 1),1,0x32,field_name_01);
    s_01._M_str = (char *)*puVar6;
    s_01._M_len = puVar6[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,6,s_01,target);
  }
  uVar12 = *(uint *)((long)&this->field_0 + 0x18);
  if (0 < (int)uVar12) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar7) goto LAB_009c1dce;
    pRVar14 = &(this->field_0)._impl_.repeatedprimitivefield_;
    *puVar7 = ':';
    target = puVar7 + 2;
    for (; 0x7f < uVar12; uVar12 = uVar12 >> 7) {
      target[-1] = (byte)uVar12 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar12;
    piVar8 = google::protobuf::RepeatedField<int>::data(pRVar14);
    iVar5 = google::protobuf::RepeatedField<int>::size(pRVar14);
    piVar1 = piVar8 + iVar5;
    do {
      pbVar9 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar10 = (ulong)*piVar8;
      while( true ) {
        target = pbVar9 + 1;
        if (uVar10 < 0x80) break;
        *pbVar9 = (byte)uVar10 | 0x80;
        uVar10 = uVar10 >> 7;
        pbVar9 = target;
      }
      piVar8 = piVar8 + 1;
      *pbVar9 = (byte)uVar10;
    } while (piVar8 < piVar1);
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x28);
  iVar13 = 0;
  if (iVar5 < 1) {
    iVar5 = iVar13;
  }
  for (; iVar5 != iVar13; iVar13 = iVar13 + 1) {
    pVVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                        (&(this->field_0)._impl_.repeatedstringfield_.super_RepeatedPtrFieldBase,
                         iVar13);
    field_name_02._M_str = in_R9;
    field_name_02._M_len = (size_t)"edition_unittest.TestCamelCaseFieldNames.RepeatedStringField";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)(pVVar11->_M_dataplus)._M_p,
               (char *)(ulong)(uint)pVVar11->_M_string_length,1,0x3c,field_name_02);
    sVar3 = pVVar11->_M_string_length;
    if (((long)sVar3 < 0x80) && ((long)sVar3 <= (long)(stream->end_ + (0xe - (long)target)))) {
      *target = 0x42;
      target[1] = (byte)sVar3;
      memcpy(target + 2,(pVVar11->_M_dataplus)._M_p,sVar3);
      target = target + sVar3 + 2;
    }
    else {
      s_02._M_str = (pVVar11->_M_dataplus)._M_p;
      s_02._M_len = sVar3;
      target = google::protobuf::io::EpsCopyOutputStream::WriteStringOutline(stream,8,s_02,target);
    }
  }
  uVar12 = (this->field_0)._impl_._repeatedenumfield_cached_byte_size_.atom_;
  if (uVar12 != 0) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    if (stream->end_ <= puVar7) {
LAB_009c1dce:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
    }
    pRVar14 = &(this->field_0)._impl_.repeatedenumfield_;
    *puVar7 = 'J';
    target = puVar7 + 2;
    for (; 0x7f < uVar12; uVar12 = uVar12 >> 7) {
      target[-1] = (byte)uVar12 | 0x80;
      target = target + 1;
    }
    target[-1] = (byte)uVar12;
    piVar8 = google::protobuf::RepeatedField<int>::data(pRVar14);
    iVar5 = google::protobuf::RepeatedField<int>::size(pRVar14);
    piVar1 = piVar8 + iVar5;
    do {
      pbVar9 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
      uVar10 = (ulong)*piVar8;
      while( true ) {
        target = pbVar9 + 1;
        if (uVar10 < 0x80) break;
        *pbVar9 = (byte)uVar10 | 0x80;
        uVar10 = uVar10 >> 7;
        pbVar9 = target;
      }
      piVar8 = piVar8 + 1;
      *pbVar9 = (byte)uVar10;
    } while (piVar8 < piVar1);
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x58);
  for (iVar13 = 0; iVar5 != iVar13; iVar13 = iVar13 + 1) {
    value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<edition_unittest::ForeignMessage>>
                         (&(this->field_0)._impl_.repeatedmessagefield_.super_RepeatedPtrFieldBase,
                          iVar13);
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (10,(MessageLite *)value_00,(value_00->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x70);
  iVar13 = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  for (; iVar5 != iVar13; iVar13 = iVar13 + 1) {
    pVVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                        (&(this->field_0)._impl_.repeatedstringpiecefield_.
                          super_RepeatedPtrFieldBase,iVar13);
    field_name_03._M_str = in_R9;
    field_name_03._M_len =
         (size_t)"edition_unittest.TestCamelCaseFieldNames.RepeatedStringPieceField";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)(pVVar11->_M_dataplus)._M_p,
               (char *)(ulong)(uint)pVVar11->_M_string_length,1,0x41,field_name_03);
    sVar3 = pVVar11->_M_string_length;
    if (((long)sVar3 < 0x80) && ((long)sVar3 <= (long)(stream->end_ + (0xe - (long)target)))) {
      *target = 0x5a;
      target[1] = (byte)sVar3;
      memcpy(target + 2,(pVVar11->_M_dataplus)._M_p,sVar3);
      target = target + sVar3 + 2;
    }
    else {
      s_03._M_str = (pVVar11->_M_dataplus)._M_p;
      s_03._M_len = sVar3;
      target = google::protobuf::io::EpsCopyOutputStream::WriteStringOutline(stream,0xb,s_03,target)
      ;
    }
  }
  iVar5 = *(int *)((long)&this->field_0 + 0x88);
  iVar13 = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  for (; iVar5 != iVar13; iVar13 = iVar13 + 1) {
    pVVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                        (&(this->field_0)._impl_.repeatedcordfield_.super_RepeatedPtrFieldBase,
                         iVar13);
    field_name_04._M_str = in_R9;
    field_name_04._M_len = (size_t)"edition_unittest.TestCamelCaseFieldNames.RepeatedCordField";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)(pVVar11->_M_dataplus)._M_p,
               (char *)(ulong)(uint)pVVar11->_M_string_length,1,0x3a,field_name_04);
    sVar3 = pVVar11->_M_string_length;
    if (((long)sVar3 < 0x80) && ((long)sVar3 <= (long)(stream->end_ + (0xe - (long)target)))) {
      *target = 0x62;
      target[1] = (byte)sVar3;
      memcpy(target + 2,(pVVar11->_M_dataplus)._M_p,sVar3);
      target = target + sVar3 + 2;
    }
    else {
      s_04._M_str = (pVVar11->_M_dataplus)._M_p;
      s_04._M_len = sVar3;
      target = google::protobuf::io::EpsCopyOutputStream::WriteStringOutline(stream,0xc,s_04,target)
      ;
    }
  }
  uVar10 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar10 & 1) != 0) {
    puVar7 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar10 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar7;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestCamelCaseFieldNames::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestCamelCaseFieldNames& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestCamelCaseFieldNames)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // int32 PrimitiveField = 1;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_primitivefield(), target);
  }

  // string StringField = 2;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::absl::string_view _s = this_._internal_stringfield();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestCamelCaseFieldNames.StringField");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // .edition_unittest.ForeignEnum EnumField = 3;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        3, this_._internal_enumfield(), target);
  }

  // .edition_unittest.ForeignMessage MessageField = 4;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        4, *this_._impl_.messagefield_, this_._impl_.messagefield_->GetCachedSize(), target,
        stream);
  }

  // string StringPieceField = 5 [ctype = STRING_PIECE];
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::absl::string_view _s = this_._internal_stringpiecefield();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestCamelCaseFieldNames.StringPieceField");
    target = stream->WriteStringMaybeAliased(5, _s, target);
  }

  // string CordField = 6 [ctype = CORD];
  if ((cached_has_bits & 0x00000004u) != 0) {
    const ::std::string& _s = this_._internal_cordfield();
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        _s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestCamelCaseFieldNames.CordField");
    target = stream->WriteStringMaybeAliased(6, _s, target);
  }

  // repeated int32 RepeatedPrimitiveField = 7;
  {
    int byte_size = this_._impl_._repeatedprimitivefield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          7, this_._internal_repeatedprimitivefield(), byte_size, target);
    }
  }

  // repeated string RepeatedStringField = 8;
  for (int i = 0, n = this_._internal_repeatedstringfield_size(); i < n; ++i) {
    const auto& s = this_._internal_repeatedstringfield().Get(i);
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestCamelCaseFieldNames.RepeatedStringField");
    target = stream->WriteString(8, s, target);
  }

  // repeated .edition_unittest.ForeignEnum RepeatedEnumField = 9;
  {
    ::size_t byte_size = this_._impl_._repeatedenumfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          9, this_._internal_repeatedenumfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.ForeignMessage RepeatedMessageField = 10;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_repeatedmessagefield_size());
       i < n; i++) {
    const auto& repfield = this_._internal_repeatedmessagefield().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            10, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // repeated string RepeatedStringPieceField = 11 [ctype = STRING_PIECE];
  for (int i = 0, n = this_._internal_repeatedstringpiecefield_size(); i < n; ++i) {
    const auto& s = this_._internal_repeatedstringpiecefield().Get(i);
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestCamelCaseFieldNames.RepeatedStringPieceField");
    target = stream->WriteString(11, s, target);
  }

  // repeated string RepeatedCordField = 12 [ctype = CORD];
  for (int i = 0, n = this_._internal_repeatedcordfield_size(); i < n; ++i) {
    const auto& s = this_._internal_repeatedcordfield().Get(i);
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
        s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormatLite::SERIALIZE, "edition_unittest.TestCamelCaseFieldNames.RepeatedCordField");
    target = stream->WriteString(12, s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestCamelCaseFieldNames)
  return target;
}